

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

int slider_check_range(t_slider *x,int v)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = ((x->x_gui).x_glist)->gl_zoom;
  if (v < iVar2 * 2) {
    v = iVar2 * 2;
  }
  iVar1 = v * 100 + -100;
  if (iVar1 < x->x_val) {
    x->x_val = iVar1;
  }
  if (x->x_lin0_log1 == 0) {
    dVar3 = x->x_max - x->x_min;
  }
  else {
    dVar3 = log(x->x_max / x->x_min);
    iVar2 = ((x->x_gui).x_glist)->gl_zoom;
  }
  x->x_k = dVar3 / (double)(v / iVar2 + -1);
  return v;
}

Assistant:

static int slider_check_range(t_slider *x, int v)
{
    if(v < IEM_SL_MINSIZE * IEMGUI_ZOOM(x))
        v = IEM_SL_MINSIZE * IEMGUI_ZOOM(x);
    if(x->x_val > (v * 100 - 100))
    {
        x->x_val = v * 100 - 100;
    }
    if(x->x_lin0_log1)
        x->x_k = log(x->x_max / x->x_min) / (double)(v/IEMGUI_ZOOM(x) - 1);
    else
        x->x_k = (x->x_max - x->x_min) / (double)(v/IEMGUI_ZOOM(x) - 1);

    return v;
}